

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool httplib::detail::read_content_with_length
               (Stream *strm,string *out,size_t len,Progress *progress)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  unsigned_long uStack_38;
  int n;
  size_t r;
  Progress *progress_local;
  size_t len_local;
  string *out_local;
  Stream *strm_local;
  
  std::__cxx11::string::assign((ulong)out,(char)len);
  uStack_38 = 0;
  while( true ) {
    if (len <= uStack_38) {
      return true;
    }
    uVar3 = std::__cxx11::string::operator[]((ulong)out);
    iVar2 = (*strm->_vptr_Stream[2])(strm,uVar3,len - uStack_38);
    if (iVar2 < 1) break;
    uStack_38 = (long)iVar2 + uStack_38;
    bVar1 = std::function::operator_cast_to_bool((function *)progress);
    if ((bVar1) &&
       (bVar1 = std::function<bool_(unsigned_long,_unsigned_long)>::operator()
                          (progress,uStack_38,len), !bVar1)) {
      return false;
    }
  }
  return false;
}

Assistant:

inline bool read_content_with_length(Stream& strm, std::string& out, size_t len, Progress progress)
{
    out.assign(len, 0);
    size_t r = 0;
    while (r < len){
        auto n = strm.read(&out[r], len - r);
        if (n <= 0) {
            return false;
        }

        r += n;

        if (progress) {
            if (!progress(r, len)) {
                return false;
            }
        }
    }

    return true;
}